

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_pred.hpp
# Opt level: O2

AssertionResult * __thiscall
iutest::AssertPred1Helper<bool(*)(int),int>
          (AssertionResult *__return_storage_ptr__,iutest *this,char *pred_str,char *expr1,
          _func_bool_int *pred,int val1)

{
  char cVar1;
  AssertionResult *pAVar2;
  int local_44;
  char *local_40;
  iutest *local_38;
  AssertionResult local_30;
  
  local_44 = (int)pred;
  local_40 = pred_str;
  local_38 = this;
  cVar1 = (*(code *)expr1)((ulong)pred & 0xffffffff);
  if (cVar1 == '\0') {
    local_30.m_message._M_dataplus._M_p = (pointer)&local_30.m_message.field_2;
    local_30.m_message._M_string_length = 0;
    local_30.m_message.field_2._M_local_buf[0] = '\0';
    local_30.m_result = false;
    pAVar2 = AssertionResult::operator<<(&local_30,(char (*) [8])"error: ");
    pAVar2 = AssertionResult::operator<<(pAVar2,(char **)&local_38);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x315952);
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_40);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [29])") evaluates to false, where ");
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x30beea);
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_40);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [4])0x30cbef);
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_44);
    AssertionResult::AssertionResult(__return_storage_ptr__,pAVar2);
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  return __return_storage_ptr__;
}

Assistant:

AssertionResult AssertPred1Helper(const char* pred_str, const char* expr1
    , PRED pred, T1 val1)
{
    if IUTEST_COND_LIKELY( (*pred)(val1) )
    {
        return AssertionSuccess();
    }
    return AssertionFailure() << "error: " << pred_str << "(" << expr1 << ") evaluates to false, where "
        << "\n" << expr1 << " : " << val1;
}